

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitTestOutput.cpp
# Opt level: O0

void __thiscall JUnitTestOutput::printFailure(JUnitTestOutput *this,TestFailure *failure)

{
  size_t sVar1;
  void *pvVar2;
  TestFailure *in_RDI;
  TestFailure *unaff_retaddr;
  char *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  TestFailure *f;
  
  if (*(long *)(*(long *)((in_RDI->testNameOnly_).bufferSize_ + 0x40) + 0x18) == 0) {
    sVar1 = (in_RDI->testNameOnly_).bufferSize_;
    *(long *)(sVar1 + 8) = *(long *)(sVar1 + 8) + 1;
    f = in_RDI;
    pvVar2 = operator_new(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,0x17cb61);
    TestFailure::TestFailure(unaff_retaddr,f);
    *(void **)(*(long *)((in_RDI->testNameOnly_).bufferSize_ + 0x40) + 0x18) = pvVar2;
  }
  return;
}

Assistant:

void JUnitTestOutput::printFailure(const TestFailure& failure)
{
    if (impl_->results_.tail_->failure_ == NULLPTR) {
        impl_->results_.failureCount_++;
        impl_->results_.tail_->failure_ = new TestFailure(failure);
    }
}